

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofXyz.cpp
# Opt level: O2

void __thiscall OpenMD::GofXyz::initializeHistogram(GofXyz *this)

{
  char cVar1;
  bool bVar2;
  StuntDouble *this_00;
  StuntDouble *this_01;
  int j;
  int i;
  GofXyz *local_180;
  SelectionManager *local_178;
  SelectionManager *local_170;
  _Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
  *local_168;
  MultipoleAdapter ma1;
  Vector3d v1;
  Vector3d xaxis;
  pair<const_int,_OpenMD::SquareMatrix3<double>_> local_128;
  Vector3d yaxis;
  Vector3d zaxis;
  Vector3d r1;
  Vector3d r3;
  RotMat3x3d rotMat;
  
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_128,&this->evaluator3_);
    SelectionManager::setSelectionSet(&this->seleMan3_,(SelectionSet *)&local_128);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_128);
  }
  cVar1 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  local_168 = (_Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
               *)&this->rotMats_;
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMD::SquareMatrix3<double>_>,_std::_Select1st<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_OpenMD::SquareMatrix3<double>_>,_std::_Select1st<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
           *)local_168);
  local_170 = &(this->super_RadialDistrFunc).seleMan1_;
  this_00 = SelectionManager::beginSelected(local_170,&i);
  local_178 = &this->seleMan3_;
  local_180 = this;
  this_01 = SelectionManager::beginSelected(local_178,&j);
  while (this_01 != (StuntDouble *)0x0 || this_00 != (StuntDouble *)0x0) {
    StuntDouble::getPos((Vector3d *)&r3.super_Vector<double,_3U>,this_01);
    StuntDouble::getPos((Vector3d *)&r1.super_Vector<double,_3U>,this_00);
    operator-((Vector<double,_3U> *)&local_128,&r3.super_Vector<double,_3U>,
              &r1.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&v1.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_128);
    if (cVar1 != '\0') {
      Snapshot::wrapVector
                (((local_180->super_RadialDistrFunc).super_StaticAnalyser.info_)->sman_->
                 currentSnapshot_,&v1);
    }
    ma1.at_ = (AtomType *)this_00[1]._vptr_StuntDouble;
    Vector<double,_3U>::Vector(&zaxis.super_Vector<double,_3U>);
    bVar2 = MultipoleAdapter::isDipole(&ma1);
    if (bVar2) {
      StuntDouble::getDipole((Vector3d *)&local_128,this_00);
      Vector<double,_3U>::operator=
                (&zaxis.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_128);
    }
    else {
      StuntDouble::getA(&rotMat,this_00);
      SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_128,&rotMat);
      operator*(&xaxis.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&local_128,
                (Vector<double,_3U> *)OpenMD::V3Z);
      Vector3<double>::operator=
                ((Vector3<double> *)&zaxis.super_Vector<double,_3U>,&xaxis.super_Vector<double,_3U>)
      ;
    }
    cross<double>((Vector3<double> *)&xaxis.super_Vector<double,_3U>,&v1,
                  (Vector3<double> *)&zaxis.super_Vector<double,_3U>);
    cross<double>((Vector3<double> *)&yaxis.super_Vector<double,_3U>,
                  (Vector3<double> *)&zaxis.super_Vector<double,_3U>,
                  (Vector3<double> *)&xaxis.super_Vector<double,_3U>);
    Vector<double,_3U>::normalize(&xaxis.super_Vector<double,_3U>);
    Vector<double,_3U>::normalize(&yaxis.super_Vector<double,_3U>);
    Vector<double,_3U>::normalize(&zaxis.super_Vector<double,_3U>);
    SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&rotMat);
    RectMatrix<double,_3U,_3U>::setRow
              ((RectMatrix<double,_3U,_3U> *)&rotMat,0,&xaxis.super_Vector<double,_3U>);
    RectMatrix<double,_3U,_3U>::setRow
              ((RectMatrix<double,_3U,_3U> *)&rotMat,1,&yaxis.super_Vector<double,_3U>);
    RectMatrix<double,_3U,_3U>::setRow
              ((RectMatrix<double,_3U,_3U> *)&rotMat,2,&zaxis.super_Vector<double,_3U>);
    local_128.first = this_00->globalIndex_;
    RectMatrix<double,_3U,_3U>::operator=
              ((RectMatrix<double,_3U,_3U> *)&local_128.second,(RectMatrix<double,_3U,_3U> *)&rotMat
              );
    std::
    _Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
    ::_M_insert_unique<std::pair<int_const,OpenMD::SquareMatrix3<double>>>(local_168,&local_128);
    this_00 = SelectionManager::nextSelected(local_170,&i);
    this_01 = SelectionManager::nextSelected(local_178,&j);
  }
  return;
}

Assistant:

void GofXyz::initializeHistogram() {
    // Calculate the center of mass of the molecule of selected
    // StuntDouble in selection1

    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    assert(seleMan1_.getSelectionCount() == seleMan3_.getSelectionCount());
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    // The Dipole direction of selection3 and position of selection3 will
    // be used to determine the y-z plane
    // v1 = s3 -s1,
    // z = origin.dipole
    // x = v1 X z
    // y = z X x
    rotMats_.clear();

    int i;
    int j;
    StuntDouble* sd1;
    StuntDouble* sd3;

    for (sd1 = seleMan1_.beginSelected(i), sd3 = seleMan3_.beginSelected(j);
         sd1 != NULL || sd3 != NULL;
         sd1 = seleMan1_.nextSelected(i), sd3 = seleMan3_.nextSelected(j)) {
      Vector3d r3 = sd3->getPos();
      Vector3d r1 = sd1->getPos();
      Vector3d v1 = r3 - r1;
      if (usePeriodicBoundaryConditions_)
        info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(v1);

      AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
      MultipoleAdapter ma1 = MultipoleAdapter(atype1);

      Vector3d zaxis;
      if (ma1.isDipole())
        zaxis = sd1->getDipole();
      else
        zaxis = sd1->getA().transpose() * V3Z;

      Vector3d xaxis = cross(v1, zaxis);
      Vector3d yaxis = cross(zaxis, xaxis);

      xaxis.normalize();
      yaxis.normalize();
      zaxis.normalize();

      RotMat3x3d rotMat;
      rotMat.setRow(0, xaxis);
      rotMat.setRow(1, yaxis);
      rotMat.setRow(2, zaxis);

      rotMats_.insert(
          std::map<int, RotMat3x3d>::value_type(sd1->getGlobalIndex(), rotMat));
    }
  }